

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

void __thiscall xmrig::Config::getJSON(Config *this,Document *doc)

{
  uint32_t uVar1;
  CudaConfig *in_RSI;
  Config *in_RDI;
  Value api;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  undefined4 in_stack_fffffffffffffd28;
  Type in_stack_fffffffffffffd2c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffd30;
  String *in_stack_fffffffffffffd48;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffd78;
  CudaConfig *pCVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffd80;
  CudaConfig *value;
  undefined1 value_00;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffd90;
  CudaConfig *doc_00;
  Document *doc_01;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  Http *in_stack_fffffffffffffdd8;
  CpuConfig *in_stack_fffffffffffffe08;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_1e8;
  GenericStringRef<char> local_1d8;
  GenericStringRef<char> local_1c8;
  GenericStringRef<char> local_1b8;
  GenericStringRef<char> local_1a8 [2];
  GenericStringRef<char> local_188;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_178;
  GenericStringRef<char> local_168;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_158;
  GenericStringRef<char> local_148;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_138 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_118 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8 [2];
  undefined1 local_d8 [32];
  GenericStringRef<char> local_b8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_a8;
  GenericStringRef<char> local_98;
  GenericStringRef<char> local_88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_78;
  GenericStringRef<char> local_68 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_48;
  GenericStringRef<char> local_38;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_18;
  CudaConfig *local_10;
  
  local_10 = in_RSI;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetObject(in_stack_fffffffffffffd30);
  local_18 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)local_10);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
  rapidjson::GenericStringRef<char>::GenericStringRef<3u>(&local_38,(char (*) [3])0x2790a3);
  String::toJSON(in_stack_fffffffffffffd48);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_48);
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(local_68,(char (*) [10])0x279111);
  String::toJSON(in_stack_fffffffffffffd48);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_78);
  rapidjson::GenericStringRef<char>::GenericStringRef<4u>(&local_88,(char (*) [4])"api");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_98,(char (*) [5])"http");
  Http::toJSON(in_stack_fffffffffffffdd8,
               (Document *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_a8);
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_b8,(char (*) [9])"autosave");
  BaseConfig::isAutoSave(&in_RDI->super_BaseConfig);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffd90,
                  (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                  SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0),in_stack_fffffffffffffd78);
  pCVar2 = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>
            ((GenericStringRef<char> *)(local_d8 + 0x10),(char (*) [11])"background");
  BaseConfig::isBackground(&in_RDI->super_BaseConfig);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffd90,
                  (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                  SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0),in_stack_fffffffffffffd78);
  doc_01 = (Document *)local_d8;
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>
            ((GenericStringRef<char> *)doc_01,(char (*) [7])"colors");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_stack_fffffffffffffd90,
                  (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                  SUB81((ulong)in_stack_fffffffffffffd80 >> 0x38,0),in_stack_fffffffffffffd78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  cpu(in_RDI);
  CpuConfig::toJSON(in_stack_fffffffffffffe08,(Document *)in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_f8);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  cl(in_RDI);
  OclConfig::toJSON((OclConfig *)pCVar2,doc_01);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_118);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  cuda(in_RDI);
  CudaConfig::toJSON(pCVar2,doc_01);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(local_138);
  pCVar2 = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_148,(char (*) [9])"log-file");
  String::toJSON(in_stack_fffffffffffffd48);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_stack_fffffffffffffd90,
            (StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
            in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_158);
  doc_00 = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_168,(char (*) [6])"pools");
  Pools::toJSON((Pools *)pCVar2,(Document *)doc_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)doc_00,(StringRefType *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
            ,in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_178);
  value = local_10;
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_188,(char (*) [11])0x279258);
  uVar1 = BaseConfig::printTime(&in_RDI->super_BaseConfig);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
             (uint)((ulong)value >> 0x20),in_stack_fffffffffffffd78);
  pCVar2 = local_10;
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  healthPrintTime(in_RDI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
             (uint)((ulong)value >> 0x20),(MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(local_1a8,(char (*) [8])"retries");
  Pools::retries(&(in_RDI->super_BaseConfig).m_pools);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
                 (int)((ulong)value >> 0x20),(MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2)
  ;
  rapidjson::GenericStringRef<char>::GenericStringRef<12u>(&local_1b8,(char (*) [12])"retry-pause");
  Pools::retryPause(&(in_RDI->super_BaseConfig).m_pools);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
                 (int)((ulong)value >> 0x20),(MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2)
  ;
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_1c8,(char (*) [7])"syslog");
  BaseConfig::isSyslog(&in_RDI->super_BaseConfig);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
                  SUB81((ulong)value >> 0x38,0),
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2);
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_1d8,(char (*) [11])"user-agent");
  String::toJSON((String *)local_10);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)value,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2);
  value_00 = (undefined1)((ulong)value >> 0x38);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_1e8);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>
            ((GenericStringRef<char> *)&stack0xfffffffffffffe08,(char (*) [6])"watch");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)doc_00,(StringRefType *)CONCAT44(uVar1,in_stack_fffffffffffffd88),
                  (bool)value_00,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)pCVar2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_28);
  return;
}

Assistant:

void xmrig::Config::getJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;

    doc.SetObject();

    auto &allocator = doc.GetAllocator();

    Value api(kObjectType);
    api.AddMember("id",                m_apiId.toJSON(), allocator);
    api.AddMember("worker-id",         m_apiWorkerId.toJSON(), allocator);

    doc.AddMember("api",               api, allocator);
    doc.AddMember("http",              m_http.toJSON(doc), allocator);
    doc.AddMember("autosave",          isAutoSave(), allocator);
    doc.AddMember("background",        isBackground(), allocator);
    doc.AddMember("colors",            Log::colors, allocator);

    doc.AddMember(StringRef(kCPU),     cpu().toJSON(doc), allocator);

#   ifdef XMRIG_FEATURE_OPENCL
    doc.AddMember(StringRef(kOcl),     cl().toJSON(doc), allocator);
#   endif

#   ifdef XMRIG_FEATURE_CUDA
    doc.AddMember(StringRef(kCuda),    cuda().toJSON(doc), allocator);
#   endif

    doc.AddMember("log-file",                   m_logFile.toJSON(), allocator);
    doc.AddMember("pools",                      m_pools.toJSON(doc), allocator);
    doc.AddMember("print-time",                 printTime(), allocator);
#   if defined(XMRIG_FEATURE_NVML)
    doc.AddMember(StringRef(kHealthPrintTime),  healthPrintTime(), allocator);
#   endif
    doc.AddMember("retries",                    m_pools.retries(), allocator);
    doc.AddMember("retry-pause",                m_pools.retryPause(), allocator);
    doc.AddMember("syslog",                     isSyslog(), allocator);
    doc.AddMember("user-agent",                 m_userAgent.toJSON(), allocator);
    doc.AddMember("watch",                      m_watch, allocator);
}